

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O2

bool __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::_add
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,IntervalT *I,RWNode **val,
          bool update)

{
  _Rb_tree_header *p_Var1;
  Offset OVar2;
  bool bVar3;
  bool bVar4;
  iterator I_00;
  initializer_list<dg::dda::RWNode_*> __l;
  initializer_list<dg::dda::RWNode_*> __l_00;
  initializer_list<dg::dda::RWNode_*> __l_01;
  allocator_type local_b2;
  less<dg::dda::RWNode_*> local_b1;
  Offset local_b0;
  IntervalT rest;
  RWNode *local_78;
  DiscreteInterval<dg::Offset> local_70;
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  local_60;
  
  if ((this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    bVar3 = splitExtBorders(this,I);
    I_00 = std::
           _Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,_std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>,_std::_Select1st<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
           ::lower_bound((_Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,_std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>,_std::_Select1st<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                          *)this,I);
    p_Var1 = &(this->_mapping)._M_t._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)I_00._M_node != p_Var1) &&
       (*(ulong *)(I_00._M_node + 1) <= (I->end).offset)) {
      rest.start.offset = (I->start).offset;
      rest.end.offset = (I->end).offset;
      do {
        while( true ) {
          OVar2.offset = rest.start.offset;
          if ((_Rb_tree_header *)I_00._M_node == p_Var1) {
            return bVar3;
          }
          if (*(type *)(I_00._M_node + 1) <= rest.start.offset) break;
          local_b0.offset = 1;
          local_70.end = Offset::operator-((Offset *)(I_00._M_node + 1),&local_b0);
          local_70.start.offset = OVar2.offset;
          local_78 = *val;
          __l_00._M_len = 1;
          __l_00._M_array = &local_78;
          std::
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
          set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
               *)&local_60,__l_00,&local_b1,&local_b2);
          std::
          _Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
          ::
          _M_emplace_hint_unique<dg::ADT::DiscreteInterval<dg::Offset>,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                    ((_Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                      *)this,(const_iterator)I_00._M_node,&local_70,
                     (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                      *)&local_60);
          std::
          _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
          ::~_Rb_tree(&local_60);
          rest.start.offset = *(type *)(I_00._M_node + 1);
          bVar3 = true;
        }
        bVar4 = DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
                _addValue<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                          ((DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *)this,
                           (_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                            )I_00._M_node,*val,update);
        bVar3 = (bool)(bVar3 | bVar4);
        if (I_00._M_node[1]._M_parent == (_Base_ptr)rest.end.offset) {
          return bVar3;
        }
        rest.start = Offset::operator+((Offset *)&I_00._M_node[1]._M_parent,(Offset)0x1);
        I_00._M_node = (_Base_ptr)std::_Rb_tree_increment(I_00._M_node);
      } while (((_Rb_tree_header *)I_00._M_node != p_Var1) &&
              (*(ulong *)(I_00._M_node + 1) <= rest.end.offset));
      local_70.start.offset = (type)*val;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_70;
      std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
      ::set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
             *)&local_60,__l_01,(less<dg::dda::RWNode_*> *)&local_b0,(allocator_type *)&local_78);
      std::
      _Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
      ::
      _M_emplace_hint_unique<dg::ADT::DiscreteInterval<dg::Offset>&,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                ((_Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                  *)this,(const_iterator)I_00._M_node,&rest,
                 (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                  *)&local_60);
      goto LAB_00122b0b;
    }
  }
  rest.start.offset = (type)*val;
  __l._M_len = 1;
  __l._M_array = (iterator)&rest;
  std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::set
            ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)&local_60,__l,(less<dg::dda::RWNode_*> *)&local_70,(allocator_type *)&local_b0);
  std::
  _Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
  ::
  _M_emplace_unique<dg::ADT::DiscreteInterval<dg::Offset>const&,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
            ((_Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
              *)this,I,
             (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)&local_60);
LAB_00122b0b:
  std::
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  ::~_Rb_tree(&local_60);
  return true;
}

Assistant:

bool _add(const IntervalT &I, const ValueT &val, bool update = false) {
        if (_mapping.empty()) {
            _mapping.emplace(I, ValuesT{val});
            return true;
        }

        // fast path
        // auto fastit = _mapping.lower_bound(I);
        // if (fastit != _mapping.end() &&
        //    fastit->first == I) {
        //    return _addValue(fastit, val, update);
        //}

        // XXX: pass the lower_bound iterator from the fast path
        // so that we do not search the mapping again
        bool changed = splitExtBorders(I);
        _check();

        // splitExtBorders() arranged the intervals such
        // that some interval starts with ours
        // and some interval ends with ours.
        // Now we just create new intervals in the gaps
        // and add values to the intervals that we have

        // FIXME: splitExtBorders() can return the iterator,
        // so that we do not need to search the map again.
        auto it = _find_ge(I);
        assert(!changed || it != _mapping.end());

        // we do not have any overlapping interval
        if (it == _mapping.end() || I.end < it->first.start) {
            assert(!overlaps(I) && "Bug in add() or in overlaps()");
            _mapping.emplace(I, ValuesT{val});
            return true;
        }

        auto rest = I;
        assert(rest.end >= it->first.start); // we must have some overlap here
        while (it != _mapping.end()) {
            if (rest.start < it->first.start) {
                // add the gap interval
                _mapping.emplace_hint(
                        it, IntervalT(rest.start, it->first.start - 1),
                        ValuesT{val});
                rest.start = it->first.start;
                changed = true;
            } else {
                // update the existing interval and shift
                // to the next interval
                assert(rest.start == it->first.start);
                changed |= _addValue(it, val, update);
                if (it->first.end == rest.end)
                    break;

                rest.start = it->first.end + 1;
                ++it;

                // our interval spans to the right
                // after the last covered interval
                if (it == _mapping.end() || it->first.start > rest.end) {
                    _mapping.emplace_hint(it, rest, ValuesT{val});
                    changed = true;
                    break;
                }
            }
        }

        _check();
        return changed;
    }